

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O3

void __thiscall
google::protobuf::internal::
MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
::SyncRepeatedFieldWithMapNoLock
          (MapField<google::protobuf::Struct_FieldsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *this)

{
  value_type *pvVar1;
  long lVar2;
  long lVar3;
  Value *this_00;
  ArenaStringPtr *this_01;
  Arena *pAVar4;
  string *psVar5;
  Value *from;
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  local_68;
  undefined1 local_50 [8];
  const_iterator it;
  
  it.it_.bucket_index_ =
       (size_type)
       (this->
       super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
       ).super_MapFieldBase.repeated_field_;
  if ((RepeatedPtrFieldBase *)it.it_.bucket_index_ == (RepeatedPtrFieldBase *)0x0) {
    pAVar4 = (this->
             super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
             ).super_MapFieldBase.arena_;
    if (pAVar4 == (Arena *)0x0) {
      it.it_.bucket_index_ = (size_type)operator_new(0x18);
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->arena_ = (Arena *)0x0;
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->current_size_ = 0;
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->total_size_ = 0;
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->rep_ = (Rep *)0x0;
    }
    else {
      if (pAVar4->hooks_cookie_ != (void *)0x0) {
        Arena::OnArenaAllocation
                  (pAVar4,(type_info *)&RepeatedPtrField<google::protobuf::Message>::typeinfo,0x18);
      }
      it.it_.bucket_index_ =
           (size_type)
           ArenaImpl::AllocateAlignedAndAddCleanup
                     (&pAVar4->impl_,0x18,
                      arena_destruct_object<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                     );
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->arena_ = pAVar4;
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->current_size_ = 0;
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->total_size_ = 0;
      ((RepeatedPtrFieldBase *)it.it_.bucket_index_)->rep_ = (Rep *)0x0;
    }
    (this->
    super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ).super_MapFieldBase.repeated_field_ =
         (RepeatedPtrField<google::protobuf::Message> *)it.it_.bucket_index_;
  }
  RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<google::protobuf::Struct_FieldsEntry_DoNotUse>::TypeHandler>
            ((RepeatedPtrFieldBase *)it.it_.bucket_index_);
  local_68.m_ = (this->impl_).map_.elements_;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
  ::InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::SearchFrom(&local_68,(local_68.m_)->index_of_first_non_null_);
  it.it_.node_ = (Node *)local_68.m_;
  local_50 = (undefined1  [8])local_68.node_;
  while( true ) {
    if (local_50 == (undefined1  [8])0x0) {
      return;
    }
    lVar2 = (**(code **)(_Struct_FieldsEntry_DoNotUse_default_instance_ + 0x20))
                      (&_Struct_FieldsEntry_DoNotUse_default_instance_,
                       (this->
                       super_TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
                       ).super_MapFieldBase.arena_);
    if ((lVar2 != 0) &&
       (lVar3 = __dynamic_cast(lVar2,&Message::typeinfo,&Struct_FieldsEntry_DoNotUse::typeinfo,0),
       lVar3 == 0)) break;
    RepeatedPtrFieldBase::
    AddAllocatedInternal<google::protobuf::RepeatedPtrField<google::protobuf::Struct_FieldsEntry_DoNotUse>::TypeHandler>
              ((RepeatedPtrFieldBase *)it.it_.bucket_index_,lVar2);
    *(uint *)(lVar2 + 0x20) = *(uint *)(lVar2 + 0x20) | 1;
    pAVar4 = *(Arena **)(lVar2 + 8);
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    this_01 = (ArenaStringPtr *)(lVar2 + 0x10);
    psVar5 = this_01->ptr_;
    if (psVar5 == (string *)&fixed_address_empty_string_abi_cxx11_) {
      ArenaStringPtr::CreateInstance
                (this_01,pAVar4,(string *)&fixed_address_empty_string_abi_cxx11_);
      psVar5 = this_01->ptr_;
    }
    std::__cxx11::string::_M_assign((string *)psVar5);
    pvVar1 = ((KeyValuePair *)local_50)->v_;
    *(uint *)(lVar2 + 0x20) = *(uint *)(lVar2 + 0x20) | 2;
    pAVar4 = *(Arena **)(lVar2 + 8);
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    this_00 = *(Value **)(lVar2 + 0x18);
    if (this_00 == (Value *)0x0) {
      this_00 = Arena::CreateMaybeMessage<google::protobuf::Value>(pAVar4);
      *(Value **)(lVar2 + 0x18) = this_00;
    }
    from = &pvVar1->second;
    if (from != this_00) {
      Value::Clear(this_00);
      Value::MergeFrom(this_00,from);
    }
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
    ::InnerMap::
    iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
    ::operator++((iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
                  *)local_50);
  }
  __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/casts.h"
                ,0x5e,
                "To google::protobuf::internal::down_cast(From *) [To = google::protobuf::Struct_FieldsEntry_DoNotUse *, From = google::protobuf::Message]"
               );
}

Assistant:

void MapField<Derived, Key, T, kKeyFieldType, kValueFieldType,
              default_enum_value>::SyncRepeatedFieldWithMapNoLock() const {
  if (this->MapFieldBase::repeated_field_ == NULL) {
    if (this->MapFieldBase::arena_ == NULL) {
      this->MapFieldBase::repeated_field_ = new RepeatedPtrField<Message>();
    } else {
      this->MapFieldBase::repeated_field_ =
          Arena::CreateMessage<RepeatedPtrField<Message> >(
              this->MapFieldBase::arena_);
    }
  }
  const Map<Key, T>& map = impl_.GetMap();
  RepeatedPtrField<EntryType>* repeated_field =
      reinterpret_cast<RepeatedPtrField<EntryType>*>(
          this->MapFieldBase::repeated_field_);

  repeated_field->Clear();

  // The only way we can get at this point is through reflection and the
  // only way we can get the reflection object is by having called GetReflection
  // on the encompassing field. So that type must have existed and hence we
  // know that this MapEntry default_type has also already been constructed.
  // So it's safe to just call internal_default_instance().
  const Message* default_entry = Derived::internal_default_instance();
  for (typename Map<Key, T>::const_iterator it = map.begin(); it != map.end();
       ++it) {
    EntryType* new_entry =
        down_cast<EntryType*>(default_entry->New(this->MapFieldBase::arena_));
    repeated_field->AddAllocated(new_entry);
    (*new_entry->mutable_key()) = it->first;
    (*new_entry->mutable_value()) = it->second;
  }
}